

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O2

int MT_basic_insert_test(void)

{
  LatencyCollector *pLVar1;
  Msg *pMVar2;
  long lVar3;
  long lVar4;
  Msg msg_stream;
  string local_128;
  LatencyDumpDefaultImpl default_dump;
  LatencyCollectorDumpOptions local_100;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> t_hdl;
  code *local_e0 [2];
  code *local_d0;
  code *local_c8;
  vector<test_args,_std::allocator<test_args>_> args;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  LatencyCollector lat;
  
  pLVar1 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(pLVar1);
  global_lat = pLVar1;
  LatencyCollector::LatencyCollector(&lat);
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::vector
            (&t_hdl,8,(allocator_type *)&local_128);
  std::vector<test_args,_std::allocator<test_args>_>::vector(&args,8,(allocator_type *)&local_128);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
    *(LatencyCollector **)
     ((long)&(args.super__Vector_base<test_args,_std::allocator<test_args>_>._M_impl.
              super__Vector_impl_data._M_start)->lat + lVar4) = &lat;
    local_e0[1] = (code *)0x0;
    local_e0[0] = insert_thread;
    local_c8 = std::
               _Function_handler<int_(TestSuite::ThreadArgs_*),_int_(*)(TestSuite::ThreadArgs_*)>::
               _M_invoke;
    local_d0 = std::
               _Function_handler<int_(TestSuite::ThreadArgs_*),_int_(*)(TestSuite::ThreadArgs_*)>::
               _M_manager;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_98 = 0;
    uStack_90 = 0;
    TestSuite::ThreadHolder::spawn
              ((ThreadHolder *)
               ((long)&(t_hdl.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar3),
               (ThreadArgs *)
               ((long)&(args.super__Vector_base<test_args,_std::allocator<test_args>_>._M_impl.
                        super__Vector_impl_data._M_start)->lat + lVar4),(ThreadFunc *)local_e0,
               (ThreadExitHandler *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)local_e0);
    lVar3 = lVar3 + 0x58;
  }
  for (lVar3 = 0; lVar3 != 0x2c0; lVar3 = lVar3 + 0x58) {
    TestSuite::ThreadHolder::join
              ((ThreadHolder *)
               ((long)&(t_hdl.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar3),false);
  }
  default_dump.super_LatencyDump._vptr_LatencyDump = (LatencyDump)&PTR_dump_abi_cxx11__0010fcd8;
  local_100.sort_by = NAME;
  local_100.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_(&local_128,&lat,&default_dump.super_LatencyDump,&local_100);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&local_128);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_128);
  local_100.sort_by = NAME;
  local_100.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_
            (&local_128,global_lat,&default_dump.super_LatencyDump,&local_100);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&local_128);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_128);
  pLVar1 = global_lat;
  if (global_lat != (LatencyCollector *)0x0) {
    LatencyCollector::~LatencyCollector(global_lat);
  }
  operator_delete(pLVar1);
  global_lat = (LatencyCollector *)0x0;
  std::_Vector_base<test_args,_std::allocator<test_args>_>::~_Vector_base
            (&args.super__Vector_base<test_args,_std::allocator<test_args>_>);
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector(&t_hdl);
  LatencyCollector::~LatencyCollector(&lat);
  return 0;
}

Assistant:

int MT_basic_insert_test() {
    global_lat = new LatencyCollector();

    size_t i;
    size_t n_threads = 8;

    LatencyCollector lat;

    std::vector<TestSuite::ThreadHolder> t_hdl(n_threads);
    std::vector<test_args> args(n_threads);
    for (i=0; i<n_threads; ++i) {
        args[i].lat = &lat;
        t_hdl[i].spawn(&args[i], insert_thread, nullptr);
    }

    for (i=0; i<n_threads; ++i){
        t_hdl[i].join();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;
    msg_stream << lat.dump(&default_dump) << std::endl;
    msg_stream << global_lat->dump(&default_dump) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}